

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

int __thiscall CVmObjDict::getp_find(CVmObjDict *this,vm_obj_id_t param_1,vm_val_t *val,uint *argc)

{
  ushort uVar1;
  vm_prop_id_t vVar2;
  uint uVar3;
  find_entry_page *__ptr;
  int iVar4;
  uint hash;
  vm_obj_id_t vVar5;
  ushort *puVar6;
  vm_val_t *this_00;
  find_ctx ctx;
  find_ctx local_78;
  
  if (getp_find(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_find();
  }
  if (argc == (uint *)0x0) {
    val->typ = VM_NATIVE_CODE;
    (val->val).ptr = &getp_find::desc;
    return 1;
  }
  uVar3 = *argc;
  iVar4 = CVmObject::get_prop_check_argc(val,argc,&getp_find::desc);
  if (iVar4 != 0) {
    return 1;
  }
  this_00 = sp_ + -1;
  puVar6 = (ushort *)vm_val_t::get_as_string(this_00);
  if (puVar6 != (ushort *)0x0) {
    uVar1 = *puVar6;
    if ((uVar3 < 2) || (sp_[-2].typ == VM_NIL)) {
      vVar2 = 0;
    }
    else {
      if (sp_[-2].typ != VM_PROP) {
        err_throw(0x7db);
      }
      vVar2 = sp_[-2].val.prop;
    }
    hash = calc_str_hash(this,this_00,(char *)(puVar6 + 1),(ulong)uVar1);
    local_78.globals = (vm_globals *)0x0;
    local_78.results_head = (find_entry_page *)0x0;
    local_78.results_tail = (find_entry_page *)0x0;
    local_78.result_free = 0x20;
    local_78.result_cnt = 0;
    local_78.strval = this_00;
    local_78.strp = (char *)(puVar6 + 1);
    local_78.strl = (ulong)uVar1;
    local_78.voc_prop = vVar2;
    local_78.dict = this;
    CVmHashTable::enum_hash_matches
              (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),hash,find_cb,&local_78);
    vVar5 = find_ctx::results_to_list(&local_78);
    val->typ = VM_OBJ;
    (val->val).obj = vVar5;
    sp_ = sp_ + -(long)(int)uVar3;
    while (__ptr = local_78.results_head, local_78.results_head != (find_entry_page *)0x0) {
      local_78.results_head = (local_78.results_head)->nxt;
      free(__ptr);
    }
    return 1;
  }
  err_throw(0x7e3);
}

Assistant:

int CVmObjDict::getp_find(VMG_ vm_obj_id_t, vm_val_t *val, uint *argc)
{
    static CVmNativeCodeDesc desc(1, 1);
    uint orig_argc = (argc != 0 ? *argc : 0);
    vm_val_t *arg0;
    vm_val_t *arg1;
    const char *strp;
    size_t strl;
    vm_prop_id_t voc_prop;
    unsigned int hash;

    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* 
     *   make sure the first argument is a string, but leave it on the stack
     *   for gc protection 
     */
    arg0 = G_stk->get(0);
    if ((strp = arg0->get_as_string(vmg0_)) == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* scan and skip the string's length prefix */
    strl = vmb_get_len(strp);
    strp += VMB_LEN;

    /* 
     *   get the property ID, which can be omitted or specified as nil to
     *   indicate any property 
     */
    if (orig_argc < 2)
        voc_prop = VM_INVALID_PROP;
    else if ((arg1 = G_stk->get(1))->typ == VM_NIL)
        voc_prop = VM_INVALID_PROP;
    else if (arg1->typ == VM_PROP)
        voc_prop = arg1->val.prop;
    else
        err_throw(VMERR_PROPPTR_VAL_REQD);

    /* calculate the hash value */
    hash = calc_str_hash(vmg_ arg0, strp, strl);

    /* enumerate everything that matches the string's hash code */
    find_ctx ctx(vmg_ this, arg0, strp, strl, voc_prop);
    get_ext()->hashtab_->enum_hash_matches(hash, &find_cb, &ctx);

    /* build a list out of the results, and return the list */
    val->set_obj(ctx.results_to_list(vmg0_));

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* success */
    return TRUE;
}